

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O2

int ffgcx(fitsfile *fptr,int colnum,LONGLONG frow,LONGLONG fbit,LONGLONG nbit,char *larray,
         int *status)

{
  uint uVar1;
  FITSfile *pFVar2;
  int iVar3;
  int iVar4;
  LONGLONG *pLVar5;
  uint uVar6;
  long lVar7;
  fitsfile *fptr_00;
  long lVar8;
  ulong uVar9;
  uchar cbuff;
  ulong local_68;
  fitsfile *local_60;
  undefined8 local_58;
  long local_50;
  long local_48;
  tcolumn *local_40;
  long offset;
  
  if (nbit < 1 || 0 < *status) {
    return *status;
  }
  if (frow < 1) {
    *status = 0x133;
    return 0x133;
  }
  if (fbit < 1) {
    *status = 0x134;
LAB_0019661e:
    iVar3 = 0x134;
  }
  else {
    local_60 = fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    pFVar2 = local_60->Fptr;
    uVar1 = pFVar2->tableptr[(long)colnum + -1].tdatatype;
    uVar6 = -uVar1;
    if (0 < (int)uVar1) {
      uVar6 = uVar1;
    }
    if (0xb < uVar6) {
      *status = 0x136;
      return 0x136;
    }
    local_68 = fbit + 7U >> 3;
    local_50 = frow + -1;
    local_40 = pFVar2->tableptr + colnum;
    if ((int)uVar1 < 1) {
      local_58 = fbit;
      ffgdes(local_60,colnum,frow,&local_48,&offset,status);
      if (uVar1 == 0xffffffff) {
        local_48 = (local_48 + 7) / 8;
      }
      if (local_48 < (long)(local_58 + nbit + 6U >> 3)) goto LAB_00196610;
      lVar7 = offset + local_60->Fptr->datastart;
      pLVar5 = &local_60->Fptr->heapstart;
    }
    else {
      local_48 = local_40[-1].trepeat;
      if (uVar1 == 1) {
        local_48 = (local_48 + 7) / 8;
      }
      if (local_48 < (long)local_68) {
LAB_00196610:
        *status = 0x134;
        goto LAB_0019661e;
      }
      lVar7 = pFVar2->rowlength * local_50 + pFVar2->datastart;
      pLVar5 = &local_40[-1].tbcol;
    }
    fptr_00 = local_60;
    local_58 = CONCAT44(local_58._4_4_,uVar1);
    lVar8 = local_68 - 1;
    iVar3 = ffmbyt(local_60,lVar7 + *pLVar5 + lVar8,0,status);
    if (iVar3 < 1) {
      uVar9 = (ulong)((uint)(fbit + 7U) & 7);
      lVar7 = 0;
      iVar3 = (int)local_58;
      local_68 = lVar8;
      while (iVar4 = ffgbyt(fptr_00,1,&cbuff,status), iVar4 < 1) {
        for (; (uVar9 < 8 && (lVar7 < nbit)); lVar7 = lVar7 + 1) {
          larray[lVar7] = (ffgcx::onbit[uVar9] & cbuff) != 0;
          uVar9 = uVar9 + 1;
        }
        if (nbit == lVar7) break;
        uVar9 = 0;
        fptr_00 = local_60;
        if (0 < iVar3) {
          local_68 = local_68 + 1;
          uVar9 = 0;
          if (local_68 == local_48) {
            local_50 = local_50 + 1;
            ffmbyt(local_60,local_60->Fptr->rowlength * local_50 + local_60->Fptr->datastart +
                            local_40[-1].tbcol,0,status);
            uVar9 = 0;
            local_68 = 0;
            fptr_00 = local_60;
          }
        }
      }
      iVar3 = *status;
    }
    else {
      iVar3 = *status;
    }
  }
  return iVar3;
}

Assistant:

int ffgcx(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int   colnum,    /* I - number of column to write (1 = 1st col) */
            LONGLONG  frow,      /* I - first row to write (1 = 1st row)        */
            LONGLONG  fbit,      /* I - first bit to write (1 = 1st)            */
            LONGLONG  nbit,      /* I - number of bits to write                 */
            char *larray,    /* O - array of logicals corresponding to bits */
            int  *status)    /* IO - error status                           */
/*
  read an array of logical values from a specified bit or byte
  column of the binary table.    larray is set = TRUE, if the corresponding
  bit = 1, otherwise it is set to FALSE.
  The binary table column being read from must have datatype 'B' or 'X'. 
*/
{
    LONGLONG bstart;
    long offset, ndone, ii, repeat, bitloc, fbyte;
    LONGLONG  rstart, estart;
    int tcode, descrp;
    unsigned char cbuff;
    static unsigned char onbit[8] = {128,  64,  32,  16,   8,   4,   2,   1};
    tcolumn *colptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  check input parameters */
    if (nbit < 1)
        return(*status);
    else if (frow < 1)
        return(*status = BAD_ROW_NUM);
    else if (fbit < 1)
        return(*status = BAD_ELEM_NUM);

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    fbyte = (long) ((fbit + 7) / 8);
    bitloc = (long) (fbit - 1 - ((fbit - 1) / 8 * 8));
    ndone = 0;
    rstart = frow - 1;
    estart = fbyte - 1;

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode = colptr->tdatatype;

    if (abs(tcode) > TBYTE)
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */

    if (tcode > 0)
    {
        descrp = FALSE;  /* not a variable length descriptor column */
        /* N.B: REPEAT is the number of bytes, not number of bits */
        repeat = (long) colptr->trepeat;

        if (tcode == TBIT)
            repeat = (repeat + 7) / 8;  /* convert from bits to bytes */

        if (fbyte > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol + estart;
    }
    else
    {
        descrp = TRUE;  /* a variable length descriptor column */
        /* only bit arrays (tform = 'X') are supported for variable */
        /* length arrays.  REPEAT is the number of BITS in the array. */

        ffgdes(fptr, colnum, frow, &repeat, &offset, status);

        if (tcode == -TBIT)
            repeat = (repeat + 7) / 8;

        if ((fbit + nbit + 6) / 8 > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + offset + (fptr->Fptr)->heapstart + estart;
    }

    /* move the i/o pointer to the start of the pixel sequence */
    if (ffmbyt(fptr, bstart, REPORT_EOF, status) > 0)
        return(*status);

    /* read the next byte */
    while (1)
    {
      if (ffgbyt(fptr, 1, &cbuff, status) > 0)
        return(*status);

      for (ii = bitloc; (ii < 8) && (ndone < nbit); ii++, ndone++)
      {
        if(cbuff & onbit[ii])       /* test if bit is set */
          larray[ndone] = TRUE;
        else
          larray[ndone] = FALSE;
      }

      if (ndone == nbit)   /* finished all the bits */
        return(*status);

      /* not done, so get the next byte */
      if (!descrp)
      {
        estart++;
        if (estart == repeat) 
        {
          /* move the i/o pointer to the next row of pixels */
          estart = 0;
          rstart = rstart + 1;
          bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol;

          ffmbyt(fptr, bstart, REPORT_EOF, status);
        }
      }
      bitloc = 0;
    }
}